

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setDamping
          (btGeneric6DofSpring2Constraint *this,int index,btScalar damping,bool limitIfNeeded)

{
  btScalar *pbVar1;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  btScalar in_XMM0_Da;
  
  if (in_ESI < 3) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x360));
    pbVar1[in_ESI] = in_XMM0_Da;
    *(byte *)(in_RDI + 0x370 + (long)in_ESI) = in_DL & 1;
  }
  else {
    *(btScalar *)(in_RDI + (long)(in_ESI + -3) * 0x58 + 0x41c) = in_XMM0_Da;
    *(byte *)(in_RDI + (long)(in_ESI + -3) * 0x58 + 0x420) = in_DL & 1;
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setDamping(int index, btScalar damping, bool limitIfNeeded)
{
	btAssert((index >= 0) && (index < 6));
	if (index<3) {
		m_linearLimits.m_springDamping[index] = damping;
		m_linearLimits.m_springDampingLimited[index] = limitIfNeeded;
	} else {
		m_angularLimits[index - 3].m_springDamping = damping;
		m_angularLimits[index - 3].m_springDampingLimited = limitIfNeeded;
	}
}